

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O0

unsigned_long_long Jupiter_strtoull_nospace(char *str,int base)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  unsigned_long_long uStack_28;
  int tval;
  unsigned_long_long total;
  uchar *puStack_18;
  int base_local;
  char *str_local;
  
  uStack_28 = 0;
  if (*str == '-') {
    iVar2 = Jupiter_strtoi_nospace(str,base);
    return (long)iVar2;
  }
  puStack_18 = (uchar *)str;
  if (*str == '+') {
    puStack_18 = (uchar *)(str + 1);
  }
  puVar3 = puStack_18;
  if (base != 0) {
    total._4_4_ = base;
    if (((base == 0x10) && (*puStack_18 == '0')) &&
       ((puVar3 = puStack_18 + 1, *puVar3 == 'x' || (*puVar3 == 'X')))) {
      puVar3 = puStack_18 + 2;
    }
    goto LAB_00194438;
  }
  if (*puStack_18 != '0') {
    total._4_4_ = 10;
    goto LAB_00194438;
  }
  uVar1 = puStack_18[1];
  if (uVar1 == 'B') {
LAB_001943c7:
    total._4_4_ = 2;
    puVar3 = puStack_18 + 2;
  }
  else {
    if (uVar1 != 'X') {
      if (uVar1 == 'b') goto LAB_001943c7;
      if (uVar1 != 'x') {
        total._4_4_ = 8;
        puVar3 = puStack_18 + 1;
        goto LAB_00194438;
      }
    }
    total._4_4_ = 0x10;
    puVar3 = puStack_18 + 2;
  }
LAB_00194438:
  while (puStack_18 = puVar3, iVar2 = Jupiter_getBase(*puStack_18,total._4_4_), iVar2 != -1) {
    uStack_28 = (long)total._4_4_ * uStack_28 + (long)iVar2;
    puVar3 = puStack_18 + 1;
  }
  return uStack_28;
}

Assistant:

unsigned long long Jupiter_strtoull_nospace(const char *str, int base)
{
	unsigned long long total = 0;
	int tval;

	if (*str == '-')
		return Jupiter_strtoi_nospace(str, base);

	if (*str == '+')
		++str;

	if (base == 0) // Guess a base.
	{
		if (*str == '0')
		{
			switch (*++str)
			{
			case 'X':
			case 'x':
				++str;
				base = 16;
				break;
			case 'B':
			case 'b':
				++str;
				base = 2;
				break;
			default:
				base = 8;
				break;
			}
		}
		else base = 10;
	}
	else if (base == 16) // check for optional preceeding hexadecimal prefix.
	{
		if (*str == '0')
		{
			++str;
			if (*str == 'x' || *str == 'X')
				++str;
		}
	}

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		++str;
	}

	return total;
}